

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcSampleVariablesTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::SampleShadingExtensionCase::iterate(SampleShadingExtensionCase *this)

{
  GLSLVersion GVar1;
  bool bVar2;
  ContextInfo *this_00;
  RenderContext *pRVar3;
  char *pcVar4;
  TestError *pTVar5;
  allocator<char> local_64a;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  allocator<char> local_592;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  allocator<char> local_541;
  string local_540;
  string local_520;
  string local_500;
  ProgramSources local_4e0;
  undefined1 local_410 [8];
  ShaderProgram programEnable;
  string local_338;
  allocator<char> local_311;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  allocator<char> local_282;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_221;
  string local_220;
  string local_200;
  string local_1e0;
  ProgramSources local_1c0;
  undefined1 local_f0 [8];
  ShaderProgram programRequire;
  TestLog *log;
  SampleShadingExtensionCase *this_local;
  
  programRequire.m_program.m_info.linkTimeUs =
       (deUint64)
       tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_sample_variables");
  if (bVar2) {
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    pcVar4 = iterate::vss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_220,pcVar4,&local_221);
    GVar1 = this->m_glslVersion;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"",&local_259);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",&local_281);
    specializeVersion(&local_200,&local_220,GVar1,&local_258,&local_280);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar4,&local_282);
    pcVar4 = iterate::fss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,pcVar4,&local_2e9);
    GVar1 = this->m_glslVersion;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"",&local_311);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"",
               (allocator<char> *)((long)&programEnable.m_program.m_info.linkTimeUs + 7));
    specializeVersion(&local_2c8,&local_2e8,GVar1,&local_310,&local_338);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,pcVar4,
               (allocator<char> *)((long)&programEnable.m_program.m_info.linkTimeUs + 6));
    glu::makeVtxFragSources(&local_1c0,&local_1e0,&local_2a8);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_f0,pRVar3,&local_1c0);
    glu::ProgramSources::~ProgramSources(&local_1c0);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&programEnable.m_program.m_info.linkTimeUs + 6));
    std::__cxx11::string::~string((string *)&local_2c8);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&programEnable.m_program.m_info.linkTimeUs + 7));
    std::__cxx11::string::~string((string *)&local_310);
    std::allocator<char>::~allocator(&local_311);
    std::__cxx11::string::~string((string *)&local_2e8);
    std::allocator<char>::~allocator(&local_2e9);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_282);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    std::__cxx11::string::~string((string *)&local_220);
    std::allocator<char>::~allocator(&local_221);
    glu::operator<<((TestLog *)programRequire.m_program.m_info.linkTimeUs,(ShaderProgram *)local_f0)
    ;
    bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_f0);
    if (!bVar2) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                 ,0x91);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_f0);
    pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
    pcVar4 = iterate::vss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_540,pcVar4,&local_541);
    GVar1 = this->m_glslVersion;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"",&local_569);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"",&local_591);
    specializeVersion(&local_520,&local_540,GVar1,&local_568,&local_590);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,pcVar4,&local_592);
    pcVar4 = iterate()::fss;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,pcVar4,&local_5f9);
    GVar1 = this->m_glslVersion;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"",&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"",&local_649);
    specializeVersion(&local_5d8,&local_5f8,GVar1,&local_620,&local_648);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b8,pcVar4,&local_64a);
    glu::makeVtxFragSources(&local_4e0,&local_500,&local_5b8);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_410,pRVar3,&local_4e0);
    glu::ProgramSources::~ProgramSources(&local_4e0);
    std::__cxx11::string::~string((string *)&local_5b8);
    std::allocator<char>::~allocator(&local_64a);
    std::__cxx11::string::~string((string *)&local_5d8);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::allocator<char>::~allocator(&local_5f9);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_592);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_590);
    std::allocator<char>::~allocator(&local_591);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator(&local_569);
    std::__cxx11::string::~string((string *)&local_540);
    std::allocator<char>::~allocator(&local_541);
    glu::operator<<((TestLog *)programRequire.m_program.m_info.linkTimeUs,(ShaderProgram *)local_410
                   );
    bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_410);
    if (!bVar2) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Compile failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcSampleVariablesTests.cpp"
                 ,0xaa);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_410);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"GL_OES_sample_variables");
  }
  return STOP;
}

Assistant:

SampleShadingExtensionCase::IterateResult SampleShadingExtensionCase::iterate()
{
	TestLog& log = m_testCtx.getLog();

	if (!m_context.getContextInfo().isExtensionSupported("GL_OES_sample_variables"))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "GL_OES_sample_variables");
		return STOP;
	}

	static char const* vss = "${VERSION_DECL}\n"
							 "in highp vec4 a_position;\n"
							 "void main()\n"
							 "{\n"
							 "    gl_Position = a_position;\n"
							 "}\n";

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_RQ}"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "    for (int i = 0; i < (gl_MaxSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = vec4(gl_SampleID, gl_SamplePosition.x, gl_SamplePosition.y, 1);\n"
								 "}\n";

		glu::ShaderProgram programRequire(m_context.getRenderContext(),
										  glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
																  specializeVersion(fss, m_glslVersion).c_str()));
		log << programRequire;
		if (!programRequire.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	{
		static char const* fss = "${VERSION_DECL}\n"
								 "${OES_SV_EN}"
								 "out highp vec4 o_color;\n"
								 "void main()\n"
								 "{\n"
								 "#if !GL_OES_sample_variables\n"
								 "    this is broken\n"
								 "#endif\n"
								 "    for (int i = 0; i < (gl_MaxSamples + 31) / 32; ++i) {\n"
								 "        gl_SampleMask[i] = gl_SampleMaskIn[i];\n"
								 "    }\n"
								 "    o_color = vec4(gl_SampleID, gl_SamplePosition.x, gl_SamplePosition.y, 1);\n"
								 "}\n";

		glu::ShaderProgram programEnable(m_context.getRenderContext(),
										 glu::makeVtxFragSources(specializeVersion(vss, m_glslVersion).c_str(),
																 specializeVersion(fss, m_glslVersion).c_str()));
		log << programEnable;
		if (!programEnable.isOk())
		{
			TCU_FAIL("Compile failed");
		}
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}